

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

Aig_Man_t *
Cgt_ManDupPartition(Aig_Man_t *pFrame,int nVarsMin,int nFlopsMin,int iStart,Aig_Man_t *pCare,
                   Vec_Vec_t *vSuppsInv,int *pnOutputs)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  Vec_Ptr_t *vLeaves;
  void **ppvVar5;
  uint *__ptr_00;
  Aig_Man_t *pNew;
  char *pcVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong local_68;
  
  local_68 = (ulong)(uint)iStart;
  if (pFrame->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(pFrame) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                  ,0x1bf,
                  "Aig_Man_t *Cgt_ManDupPartition(Aig_Man_t *, int, int, int, Aig_Man_t *, Vec_Vec_t *, int *)"
                 );
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr + 2) = pvVar4;
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vLeaves->pArray = ppvVar5;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar4;
  pNew = Aig_ManStart(nVarsMin);
  pcVar6 = (char *)malloc(10);
  builtin_strncpy(pcVar6,"partition",10);
  pNew->pName = pcVar6;
  Aig_ManIncrementTravId(pFrame);
  pFrame->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pFrame->pConst1->TravId = pFrame->nTravIds;
  if (0 < nFlopsMin) {
    uVar11 = nFlopsMin + iStart;
    local_68 = (ulong)(uint)iStart;
    uVar3 = iStart + 1U;
    if ((int)(iStart + 1U) < (int)uVar11) {
      uVar3 = uVar11;
    }
    do {
      if (pFrame->nObjs[3] <= (int)local_68) goto LAB_008e3459;
      if ((iStart < 0) || (pFrame->vCos->nSize <= (int)local_68)) goto LAB_008e36ed;
      pvVar4 = pFrame->vCos->pArray[local_68];
      Cgt_ManDupPartition_rec
                (pNew,pFrame,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),
                 vLeaves);
      if (((ulong)pvVar4 & 1) != 0) goto LAB_008e370c;
      uVar7 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28);
      }
      uVar13 = __ptr[1];
      uVar1 = *__ptr;
      if (uVar13 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar1 * 2;
          if ((int)uVar12 <= (int)uVar1) goto LAB_008e3390;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar1 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar8;
        *__ptr = uVar12;
      }
LAB_008e3390:
      __ptr[1] = uVar13 + 1;
      *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar13 * 8) = uVar7;
      uVar13 = __ptr_00[1];
      uVar1 = *__ptr_00;
      if (uVar13 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar1 * 2;
          if ((int)uVar12 <= (int)uVar1) goto LAB_008e3403;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar1 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar1 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar8;
        *__ptr_00 = uVar12;
      }
LAB_008e3403:
      __ptr_00[1] = uVar13 + 1;
      *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar13 * 8) = pvVar4;
      local_68 = local_68 + 1;
    } while ((int)local_68 < (int)uVar11);
    local_68 = (ulong)uVar3;
  }
LAB_008e3459:
  if (pNew->vObjs->nSize - pNew->nDeleted < nVarsMin) {
    uVar7 = local_68 & 0xffffffff;
    while ((int)uVar7 < pFrame->nObjs[3]) {
      if (((int)local_68 < 0) || (pFrame->vCos->nSize <= (int)uVar7)) goto LAB_008e36ed;
      pvVar4 = pFrame->vCos->pArray[uVar7];
      Cgt_ManDupPartition_rec
                (pNew,pFrame,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),
                 vLeaves);
      if (((ulong)pvVar4 & 1) != 0) {
LAB_008e370c:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar9 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28);
      }
      uVar3 = __ptr[1];
      uVar11 = *__ptr;
      if (uVar3 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar13 = 0x10;
        }
        else {
          uVar13 = uVar11 * 2;
          if ((int)uVar13 <= (int)uVar11) goto LAB_008e353d;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar11 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar8;
        *__ptr = uVar13;
      }
LAB_008e353d:
      __ptr[1] = uVar3 + 1;
      *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = uVar9;
      uVar3 = __ptr_00[1];
      uVar11 = *__ptr_00;
      if (uVar3 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar13 = 0x10;
        }
        else {
          uVar13 = uVar11 * 2;
          if ((int)uVar13 <= (int)uVar11) goto LAB_008e35b0;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar11 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar11 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar8;
        *__ptr_00 = uVar13;
      }
LAB_008e35b0:
      __ptr_00[1] = uVar3 + 1;
      *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar3 * 8) = pvVar4;
      uVar7 = uVar7 + 1;
      if (nVarsMin <= pNew->vObjs->nSize - pNew->nDeleted) break;
    }
  }
  uVar3 = __ptr[1];
  if (pCare != (Aig_Man_t *)0x0) {
    Cgt_ManConstructCare(pNew,pCare,vSuppsInv,vLeaves);
  }
  uVar11 = __ptr_00[1];
  if (0 < (long)(int)uVar11) {
    uVar9 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar9;
    }
    do {
      if (uVar7 == uVar9) {
LAB_008e36ed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar2 = *(long *)(*(long *)(__ptr_00 + 2) + uVar9 * 8);
      pAVar10 = Aig_ObjCreateCo(pNew,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar9 * 8));
      *(Aig_Obj_t **)(lVar2 + 0x28) = pAVar10;
      uVar9 = uVar9 + 1;
    } while ((long)(int)uVar11 != uVar9);
  }
  if (pnOutputs != (int *)0x0) {
    *pnOutputs = uVar11;
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  return pNew;
}

Assistant:

Aig_Man_t * Cgt_ManDupPartition( Aig_Man_t * pFrame, int nVarsMin, int nFlopsMin, int iStart, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, int * pnOutputs )
{
    Vec_Ptr_t * vRoots, * vLeaves, * vPos;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pFrame) == 0 );
    vRoots = Vec_PtrAlloc( 100 );
    vLeaves = Vec_PtrAlloc( 100 ); 
    vPos = Vec_PtrAlloc( 100 );
    pNew = Aig_ManStart( nVarsMin );
    pNew->pName = Abc_UtilStrsav( "partition" );
    Aig_ManIncrementTravId( pFrame );
    Aig_ManConst1(pFrame)->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pFrame, Aig_ManConst1(pFrame) );
    for ( i = iStart; i < iStart + nFlopsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    for ( ; Aig_ManObjNum(pNew) < nVarsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    assert( nFlopsMin >= Vec_PtrSize(vRoots) || Vec_PtrSize(vRoots) >= nFlopsMin );
    // create constaints
    if ( pCare )
        Cgt_ManConstructCare( pNew, pCare, vSuppsInv, vLeaves );
    // create POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
        pObj->pData = (Aig_Obj_t *)Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vRoots, i) );
    if ( pnOutputs != NULL )
        *pnOutputs = Vec_PtrSize( vPos );
    Vec_PtrFree( vRoots );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vPos );
    return pNew;
}